

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.h
# Opt level: O3

SampledSpectrum __thiscall
pbrt::RandomWalkIntegrator::Li
          (RandomWalkIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,
          SamplerHandle *sampler,ScratchBuffer *scratchBuffer,VisibleSurface *visibleSurface)

{
  int iVar1;
  undefined1 auVar3 [16];
  ulong uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar11 [56];
  undefined1 auVar13 [56];
  SampledSpectrum SVar14;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_70;
  RayDifferential local_68;
  int iVar2;
  undefined1 auVar10 [64];
  undefined1 auVar12 [64];
  
  local_68.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x =
       (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
  local_68.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y =
       (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
  uVar7 = *(undefined8 *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
  uVar8 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
  local_68.super_Ray._20_8_ =
       *(undefined8 *)&(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
  local_68.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar7;
  local_68.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)((ulong)uVar7 >> 0x20);
  local_68.super_Ray.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           )(ray->super_Ray).medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  local_68.hasDifferentials = ray->hasDifferentials;
  local_68._41_3_ = *(undefined3 *)&ray->field_0x29;
  local_68.rxOrigin.super_Tuple3<pbrt::Point3,_float>.x =
       (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x;
  local_68.rxOrigin.super_Tuple3<pbrt::Point3,_float>.y =
       (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y;
  local_68.rxOrigin.super_Tuple3<pbrt::Point3,_float>.z =
       (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z;
  uVar5 = (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x;
  uVar6 = (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y;
  uVar7 = *(undefined8 *)&(ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z;
  uVar4._0_4_ = (ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x;
  uVar4._4_4_ = (ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y;
  local_68._76_8_ = *(undefined8 *)&(ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z;
  local_68.ryDirection.super_Tuple3<pbrt::Vector3,_float>.y =
       (ray->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y;
  local_68.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z =
       (ray->ryDirection).super_Tuple3<pbrt::Vector3,_float>.z;
  local_68.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar7;
  local_68.rxDirection.super_Tuple3<pbrt::Vector3,_float>.x = (float)((ulong)uVar7 >> 0x20);
  local_70.bits =
       (sampler->
       super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
       ).bits;
  auVar11 = ZEXT856((ulong)local_68.rxOrigin.super_Tuple3<pbrt::Point3,_float>._4_8_);
  auVar13 = ZEXT856(uVar4);
  local_68.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar8;
  local_68.ryOrigin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar5;
  local_68.ryOrigin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar6;
  local_68.rxDirection.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar4._4_4_;
  SVar14 = LiRandomWalk(this,&local_68,lambda,(SamplerHandle *)&local_70,scratchBuffer,0);
  auVar12._0_8_ = SVar14.values.values._8_8_;
  auVar12._8_56_ = auVar13;
  auVar10._0_8_ = SVar14.values.values._0_8_;
  auVar10._8_56_ = auVar11;
  auVar3 = vmovlhps_avx(auVar10._0_16_,auVar12._0_16_);
  auVar9 = *(undefined1 (*) [16])(lambda->pdf).values;
  uVar4 = vcmpps_avx512vl(auVar9,ZEXT816(0) << 0x40,4);
  auVar9 = vdivps_avx512vl(auVar3,auVar9);
  iVar1 = (uint)((byte)uVar4 & 1) * auVar9._0_4_;
  iVar2 = (uint)((byte)(uVar4 >> 1) & 1) * auVar9._4_4_;
  auVar9 = CONCAT412((uint)((byte)(uVar4 >> 3) & 1) * auVar9._12_4_,
                     CONCAT48((uint)((byte)(uVar4 >> 2) & 1) * auVar9._8_4_,CONCAT44(iVar2,iVar1)));
  auVar9 = vshufpd_avx(auVar9,auVar9,1);
  SVar14.values.values._8_8_ = auVar9._0_8_;
  SVar14.values.values[0] = (float)iVar1;
  SVar14.values.values[1] = (float)iVar2;
  return (SampledSpectrum)SVar14.values.values;
}

Assistant:

SampledSpectrum Li(RayDifferential ray, SampledWavelengths &lambda,
                       SamplerHandle sampler, ScratchBuffer &scratchBuffer,
                       VisibleSurface *visibleSurface) const {
        SampledSpectrum L = LiRandomWalk(ray, lambda, sampler, scratchBuffer, 0);
        return SafeDiv(L, lambda.PDF());
    }